

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t archive_mstring_copy_wcs_len(archive_mstring *aes,wchar_t *wcs,size_t len)

{
  aes->aes_set = L'\x04';
  (aes->aes_mbs).length = 0;
  (aes->aes_utf8).length = 0;
  (aes->aes_wcs).length = 0;
  if (wcs == (wchar_t *)0x0) {
    wcs = (wchar_t *)0x0;
  }
  archive_wstrncat(&aes->aes_wcs,wcs,len);
  return L'\0';
}

Assistant:

int
archive_mstring_copy_wcs_len(struct archive_mstring *aes, const wchar_t *wcs,
    size_t len)
{
	if (wcs == NULL) {
		aes->aes_set = 0;
	}
	aes->aes_set = AES_SET_WCS; /* Only WCS form set. */
	archive_string_empty(&(aes->aes_mbs));
	archive_string_empty(&(aes->aes_utf8));
	archive_wstrncpy(&(aes->aes_wcs), wcs, len);
	return (0);
}